

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  size_t n;
  long lVar2;
  ulong uVar3;
  undefined8 uStack_40;
  _Bool sum [8];
  _Bool b [8];
  _Bool a [8];
  
  uStack_40 = 0x101187;
  printf("Please enter a and b as %d-bit binary numbers\n",8);
  lVar2 = 8;
  uStack_40 = 0x1011a1;
  input_binary(a,8,"a = ");
  uStack_40 = 0x1011b8;
  input_binary(b,8,"b = ");
  uStack_40 = 0x1011c9;
  _Var1 = sum_binary(a,b,8,sum);
  uStack_40 = 0x1011d9;
  printf(anon_var_dwarf_6d);
  if (_Var1) {
    uStack_40 = 0x1011e6;
    putchar(0x31);
  }
  while (lVar2 != 0) {
    uStack_40 = 0x1011fc;
    putchar(sum[lVar2 + -1] | 0x30);
    lVar2 = lVar2 + -1;
  }
  uStack_40 = 0x101209;
  putchar(10);
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 | (ulong)sum[lVar2] << ((byte)lVar2 & 0x3f);
  }
  uStack_40 = 0x101230;
  printf("  = %lu\n",uVar3);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  bool a[N_BITS];
  bool b[N_BITS];
  bool sum[N_BITS];

  // Input the numbers
  printf("Please enter a and b as %d-bit binary numbers\n", N_BITS);
  input_binary(a, N_BITS, "a = ");
  input_binary(b, N_BITS, "b = ");
  bool overflow = sum_binary(a, b, N_BITS, sum);

  printf("\u03a3 = ");
  // Print the carry bit if necessary
  if (overflow) printf("1");
  // Print each bit (back in big endian)
  for (size_t n = 0; n < N_BITS; n++) {
    printf("%c", sum[N_BITS - n - 1] ? '1' : '0');
  }
  printf("\n");

#if N_BITS <= 64
  // Convert the number in base 10
  uint64_t sum_b10 = 0;
  for (size_t n = 0; n < N_BITS; n++) {
    sum_b10 |= (uint64_t)sum[n] << n;
  }
  printf("  = %" PRIu64 "\n", sum_b10);
#endif

  return 0;
}